

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O1

void build_output_uttfile(char *buf,char *dir,char *uttid,char *ctlspec)

{
  int iVar1;
  size_t sVar2;
  cmd_ln_t *cmdln;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  
  sVar2 = strlen(dir);
  uVar5 = (uint)sVar2;
  if (4 < (int)uVar5) {
    iVar1 = strcmp(dir + ((ulong)(uVar5 & 0x7fffffff) - 4),",CTL");
    if (iVar1 == 0) {
      uttid = ctlspec;
      pcVar4 = buf;
      if (*ctlspec != '/') {
        strcpy(buf,dir);
        buf[uVar5 - 4] = '/';
        pcVar4 = buf + ((ulong)(uVar5 & 0x7fffffff) - 3);
      }
      goto LAB_00114699;
    }
  }
  strcpy(buf,dir);
  buf[(int)uVar5] = '/';
  pcVar4 = buf + (int)uVar5 + 1;
LAB_00114699:
  strcpy(pcVar4,uttid);
  cmdln = cmd_ln_get();
  lVar3 = cmd_ln_int_r(cmdln,"-build_outdirs");
  if (lVar3 == 0) {
    return;
  }
  pcVar4 = __ckd_salloc__(buf,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                          ,0x12f);
  path2dirname(buf,pcVar4);
  build_directory(pcVar4);
  ckd_free(pcVar4);
  return;
}

Assistant:

static void
build_output_uttfile(char *buf, char *dir, char *uttid, char *ctlspec)
{
    int32 k;

    k = strlen(dir);
    if ((k > 4) && (strcmp(dir + k - 4, ",CTL") == 0)) {        /* HACK!! Hardwired ,CTL */
        if (ctlspec[0] != '/') {
            strcpy(buf, dir);
            buf[k - 4] = '/';
            strcpy(buf + k - 3, ctlspec);
        }
        else
            strcpy(buf, ctlspec);
    }
    else {
        strcpy(buf, dir);
        buf[k] = '/';
        strcpy(buf + k + 1, uttid);
    }
    /* Build output directory structure if possible/requested (it is
     * by default). */
    if (cmd_ln_boolean("-build_outdirs")) {
        char *dirname = ckd_salloc(buf);
        path2dirname(buf, dirname);
        build_directory(dirname);
        ckd_free(dirname);
    }
}